

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  int local_4c;
  size_t sStack_48;
  int val_1;
  size_t len;
  char buff [4];
  int local_2c;
  ulong uStack_28;
  int val;
  size_t i;
  string *local_18;
  string *s_local;
  string *result;
  
  i._7_1_ = 0;
  local_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (uStack_28 = 0; uVar4 = uStack_28, uVar2 = std::__cxx11::string::size(), uVar4 < uVar2;
      uStack_28 = uStack_28 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if ((*pcVar3 == '%') &&
       (uVar4 = uStack_28 + 1, uVar2 = std::__cxx11::string::size(), uVar4 < uVar2)) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if (*pcVar3 == 'u') {
        local_2c = 0;
        bVar1 = from_hex_to_i(local_18,uStack_28 + 2,4,&local_2c);
        if (bVar1) {
          sStack_48 = to_utf8(local_2c,(char *)&len);
          if (sStack_48 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&len);
          }
          uStack_28 = uStack_28 + 5;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
        }
      }
      else {
        local_4c = 0;
        bVar1 = from_hex_to_i(local_18,uStack_28 + 1,2,&local_4c);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)local_4c);
          uStack_28 = uStack_28 + 2;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
        }
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if (*pcVar3 == '+') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (size_t i = 0; i < s.size(); i++) {
        if (s[i] == '%' && i + 1 < s.size()) {
            if (s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}